

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

EntryType * __thiscall
JsUtil::
BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::AllocateEntries(BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *this,int size,bool zeroAllocate)

{
  undefined1 auVar1 [16];
  EntryType *pEVar2;
  code *AllocFunc;
  size_t byteSize;
  long lVar3;
  
  if (size == 0) {
    pEVar2 = (EntryType *)&DAT_00000008;
  }
  else {
    if (zeroAllocate) {
      AllocFunc = Memory::JitArenaAllocator::AllocZero;
    }
    else {
      AllocFunc = Memory::JitArenaAllocator::Alloc;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)size;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(0x18),0);
    }
    lVar3 = 0;
    pEVar2 = (EntryType *)
             new__<Memory::JitArenaAllocator>
                       (byteSize,this->alloc,(offset_in_JitArenaAllocator_to_subr)AllocFunc);
    do {
      ValueRelativeOffset::ValueRelativeOffset
                ((ValueRelativeOffset *)
                 ((long)&(pEVar2->
                         super_DefaultHashedEntry<unsigned_int,_ValueRelativeOffset,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                         ).super_ImplicitKeyValueEntry<unsigned_int,_ValueRelativeOffset>.
                         super_ValueEntry<ValueRelativeOffset,_JsUtil::(anonymous_namespace)::ValueEntryData<ValueRelativeOffset>_>
                         .super_ValueEntryData<ValueRelativeOffset>.value.baseValue + lVar3));
      lVar3 = lVar3 + 0x18;
    } while ((long)size * 0x18 != lVar3);
  }
  return pEVar2;
}

Assistant:

EntryType * AllocateEntries(DECLSPEC_GUARD_OVERFLOW int size, const bool zeroAllocate = true)
        {
            // Note that the choice of leaf/non-leaf node is decided for the EntryType on the basis of TValue. By default, if
            // TValue is a pointer, a non-leaf allocation is done. This behavior can be overridden by specializing
            // TypeAllocatorFunc for TValue.
            return
                AllocateArray<AllocatorType, EntryType, false>(
                    TRACK_ALLOC_INFO(alloc, EntryType, AllocatorType, 0, size),
                    zeroAllocate ? EntryAllocatorFuncType::GetAllocZeroFunc() : EntryAllocatorFuncType::GetAllocFunc(),
                    size);
        }